

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O2

void __thiscall QObject::~QObject(QObject *this)

{
  QAtomicInt *pQVar1;
  QBasicMutex *mutex;
  long lVar2;
  QObjectPrivate *this_00;
  _func_int **pp_Var3;
  __pointer_type pEVar4;
  ConnectionData *this_01;
  Connection *pCVar5;
  QObject *sender;
  ConnectionData *this_02;
  QObjectData *pQVar6;
  ulong uVar7;
  int iVar8;
  bool bVar9;
  int iVar10;
  long lVar11;
  QBasicMutex *pQVar12;
  long in_FS_OFFSET;
  long local_90;
  QSlotObjectBase *local_88;
  __sighandler_t local_68 [2];
  QMessageLogger local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->_vptr_QObject = (_func_int **)&PTR_metaObject_00665b68;
  this_00 = (QObjectPrivate *)(this->d_ptr).d;
  *(uint *)&(this_00->super_QObjectData).field_0x30 =
       *(uint *)&(this_00->super_QObjectData).field_0x30 & 0xfffffff9 | 4;
  if (((this_00->super_QObjectData).bindingStorage.bindingStatus == (QBindingStatus *)0x0) &&
     (pp_Var3 = (this->d_ptr).d[1].q_ptr[5]._vptr_QObject, pp_Var3 != (_func_int **)0x0)) {
    QThreadPrivate::removeObjectWithPendingBindingStatusChange((QThreadPrivate *)pp_Var3[1],this);
  }
  QBindingStorage::clear(&(this_00->super_QObjectData).bindingStorage);
  pEVar4 = (this_00->sharedRefcount).
           super_QBasicAtomicPointer<QtSharedPointer::ExternalRefCountData>._q_value._M_b._M_p;
  if (pEVar4 != (__pointer_type)0x0) {
    if (0 < (__int_type_conflict)(pEVar4->strongref)._q_value.super___atomic_base<int>) {
      local_58.context.version = 2;
      local_58.context.function._4_4_ = 0;
      local_58.context.line = 0;
      local_58.context.file._0_4_ = 0;
      local_58.context.file._4_4_ = 0;
      local_58.context.function._0_4_ = 0;
      local_58.context.category = "default";
      QMessageLogger::warning
                (&local_58,
                 "QObject: shared QObject was deleted directly. The program is malformed and may crash."
                );
    }
    (pEVar4->strongref)._q_value.super___atomic_base<int> = (__atomic_base<int>)0x0;
    LOCK();
    (pEVar4->weakref)._q_value = (Type)((int)(pEVar4->weakref)._q_value + -1);
    UNLOCK();
    if ((__atomic_base<int>)*(__int_type_conflict *)&(pEVar4->weakref)._q_value ==
        (__atomic_base<int>)0x0) {
      operator_delete(pEVar4);
    }
  }
  if (((this_00->super_QObjectData).field_0x31 & 4) == 0) {
    bVar9 = QObjectPrivate::isSignalConnected(this_00,0,true);
    if (bVar9) {
      destroyed(this,this);
    }
  }
  if (((this_00->super_QObjectData).field_0x30 & 8) == 0) {
    if (QAbstractDeclarativeData::destroyed !=
        (_func_void_QAbstractDeclarativeData_ptr_QObject_ptr *)0x0 &&
        (this_00->field_3).declarativeData != (QAbstractDeclarativeData *)0x0) {
      (*QAbstractDeclarativeData::destroyed)((this_00->field_3).declarativeData,this);
    }
  }
  this_01 = (this_00->connections).super_QBasicAtomicPointer<QObjectPrivate::ConnectionData>.
            _q_value._M_b._M_p;
  if (this_01 != (ConnectionData *)0x0) {
    if (this_01->currentSender != (Sender *)0x0) {
      QObjectPrivate::Sender::receiverDeleted(this_01->currentSender);
      this_01->currentSender = (Sender *)0x0;
    }
    uVar7 = ((ulong)this & 0xffffffff) % 0x418;
    mutex = (QBasicMutex *)((long)&_q_ObjectMutexPool[0].d_ptr._q_value._M_b._M_p + uVar7);
    local_58.context.version = -0x55555556;
    local_58.context.line = -0x55555556;
    local_58.context.file._0_4_ = 0xaaaaaaaa;
    local_58.context.file._4_4_ = 0xaaaaaaaa;
    QMutexLocker<QBasicMutex>::QMutexLocker((QMutexLocker<QBasicMutex> *)&local_58,mutex);
    lVar11 = -1;
    local_90 = -1;
    if (((__pointer_type)
        (this_01->signalVector).super_QBasicAtomicPointer<QObjectPrivate::SignalVector>._q_value.
        _M_b)._M_p != (__pointer_type)0x0) {
      local_90 = (long)*(int *)((long)(this_01->signalVector).
                                      super_QBasicAtomicPointer<QObjectPrivate::SignalVector>.
                                      _q_value._M_b + 8);
    }
    iVar8 = (int)(uVar7 >> 3);
    for (; lVar11 < local_90; lVar11 = lVar11 + 1) {
      lVar2 = (long)(this_01->signalVector).super_QBasicAtomicPointer<QObjectPrivate::SignalVector>.
                    _q_value._M_b + lVar11 * 0x10;
      while (pCVar5 = *(Connection **)(lVar2 + 0x20), pCVar5 != (Connection *)0x0) {
        pQVar12 = (QBasicMutex *)
                  ((long)&_q_ObjectMutexPool[0].d_ptr._q_value._M_b._M_p +
                  (ulong)((uint)(((ulong)(pCVar5->receiver).super_QBasicAtomicPointer<QObject>.
                                         _q_value._M_b._M_p & 0xffffffff) % 0x418) & 0x7f8));
        bVar9 = QOrderedMutexLocker::relock(mutex,pQVar12);
        if ((pCVar5 == *(Connection **)(lVar2 + 0x20)) &&
           ((pCVar5->receiver).super_QBasicAtomicPointer<QObject>._q_value._M_b._M_p !=
            (__pointer_type)0x0)) {
          QObjectPrivate::ConnectionData::removeConnection(this_01,pCVar5);
        }
        if (bVar9) {
          QBasicMutex::unlock(pQVar12);
        }
      }
    }
    while (pCVar5 = this_01->senders, pCVar5 != (Connection *)0x0) {
      sender = pCVar5->sender;
      iVar10 = (**sender->_vptr_QObject)(sender);
      local_68[0] = QMetaObjectPrivate::signal
                              (iVar10,(__sighandler_t)
                                      (ulong)(uint)((*(int *)&pCVar5->field_0x54 << 5) >> 5));
      (*sender->_vptr_QObject[0xb])(sender,local_68);
      uVar7 = ((ulong)sender & 0xffffffff) % 0x418;
      pQVar12 = (QBasicMutex *)
                ((long)&_q_ObjectMutexPool[0].d_ptr._q_value._M_b._M_p +
                (ulong)((uint)uVar7 & 0x7f8));
      bVar9 = QOrderedMutexLocker::relock(mutex,pQVar12);
      if (pCVar5 == this_01->senders) {
        this_02 = (ConnectionData *)(sender->d_ptr).d[1].parent;
        if ((*(uint *)&pCVar5->field_0x54 >> 0x1d & 1) == 0) {
          local_88 = (QSlotObjectBase *)0x0;
        }
        else {
          local_88 = (pCVar5->field_6).slotObj;
          *(uint *)&pCVar5->field_0x54 = *(uint *)&pCVar5->field_0x54 & 0xdfffffff;
        }
        iVar10 = (int)(uVar7 >> 3);
        QObjectPrivate::ConnectionData::removeConnection(this_02,pCVar5);
        if (iVar8 != iVar10) {
          QBasicMutex::unlock((QBasicMutex *)
                              CONCAT44(local_58.context.line,local_58.context.version));
          local_58.context.file._0_4_ = (uint)local_58.context.file & 0xffffff00;
        }
        QObjectPrivate::ConnectionData::cleanOrphanedConnections
                  (this_02,sender,AlreadyLockedAndTemporarilyReleasingLock);
        if (bVar9) {
          QBasicMutex::unlock(pQVar12);
        }
        if (iVar8 == iVar10) {
          QBasicMutex::unlock((QBasicMutex *)
                              CONCAT44(local_58.context.line,local_58.context.version));
          local_58.context.file._0_4_ = (uint)local_58.context.file & 0xffffff00;
        }
        if (local_88 != (QSlotObjectBase *)0x0) {
          QtPrivate::QSlotObjectBase::destroyIfLastRef(local_88);
        }
        QBasicMutex::lock((QBasicMutex *)CONCAT44(local_58.context.line,local_58.context.version));
        local_58.context.file._0_4_ = CONCAT31(local_58.context.file._1_3_,1);
      }
      else {
        QBasicMutex::unlock(pQVar12);
      }
    }
    (this_01->currentConnectionId).super_QBasicAtomicInteger<unsigned_int>._q_value = (Type)0x0;
    QMutexLocker<QBasicMutex>::~QMutexLocker((QMutexLocker<QBasicMutex> *)&local_58);
    LOCK();
    pQVar1 = &this_01->ref;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value +
               -1);
    UNLOCK();
    if ((__atomic_base<int>)
        *(__int_type_conflict *)
         &(pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value ==
        (__atomic_base<int>)0x0) {
      QObjectPrivate::ConnectionData::~ConnectionData(this_01);
      operator_delete(this_01,0x28);
    }
  }
  (this_00->connections).super_QBasicAtomicPointer<QObjectPrivate::ConnectionData>._q_value._M_b.
  _M_p = (__pointer_type)0x0;
  if ((this_00->super_QObjectData).children.d.size != 0) {
    QObjectPrivate::deleteChildren(this_00);
  }
  if (qtHookData[4] != 0) {
    (*(code *)qtHookData[4])(this);
  }
  if ((this_00->super_QObjectData).parent != (QObject *)0x0) {
    QObjectPrivate::setParent_helper(this_00,(QObject *)0x0);
  }
  pQVar6 = (this->d_ptr).d;
  if (pQVar6 != (QObjectData *)0x0) {
    (*pQVar6->_vptr_QObjectData[1])();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QObject::~QObject()
{
    Q_D(QObject);
    d->wasDeleted = true;
    d->blockSig = 0; // unblock signals so we always emit destroyed()

    if (!d->bindingStorage.isValid()) {
        // this might be the case after an incomplete thread-move
        // remove this object from the pending list in that case
        if (QThread *ownThread = thread()) {
            auto *privThread = static_cast<QThreadPrivate *>(
                        QObjectPrivate::get(ownThread));
            privThread->removeObjectWithPendingBindingStatusChange(this);
        }
    }

    // If we reached this point, we need to clear the binding data
    // as the corresponding properties are no longer useful
    d->clearBindingStorage();

    QtSharedPointer::ExternalRefCountData *sharedRefcount = d->sharedRefcount.loadRelaxed();
    if (sharedRefcount) {
        if (sharedRefcount->strongref.loadRelaxed() > 0) {
            qWarning("QObject: shared QObject was deleted directly. The program is malformed and may crash.");
            // but continue deleting, it's too late to stop anyway
        }

        // indicate to all QWeakPointers that this QObject has now been deleted
        sharedRefcount->strongref.storeRelaxed(0);
        if (!sharedRefcount->weakref.deref())
            delete sharedRefcount;
    }

    if (!d->wasWidget && d->isSignalConnected(0)) {
        emit destroyed(this);
    }

    if (!d->isDeletingChildren && d->declarativeData && QAbstractDeclarativeData::destroyed)
        QAbstractDeclarativeData::destroyed(d->declarativeData, this);

    QObjectPrivate::ConnectionData *cd = d->connections.loadAcquire();
    if (cd) {
        if (cd->currentSender) {
            cd->currentSender->receiverDeleted();
            cd->currentSender = nullptr;
        }

        QBasicMutex *signalSlotMutex = signalSlotLock(this);
        QMutexLocker locker(signalSlotMutex);

        // disconnect all receivers
        int receiverCount = cd->signalVectorCount();
        for (int signal = -1; signal < receiverCount; ++signal) {
            QObjectPrivate::ConnectionList &connectionList = cd->connectionsForSignal(signal);

            while (QObjectPrivate::Connection *c = connectionList.first.loadRelaxed()) {
                Q_ASSERT(c->receiver.loadAcquire());

                QBasicMutex *m = signalSlotLock(c->receiver.loadRelaxed());
                bool needToUnlock = QOrderedMutexLocker::relock(signalSlotMutex, m);
                if (c == connectionList.first.loadAcquire() && c->receiver.loadAcquire()) {
                    cd->removeConnection(c);
                    Q_ASSERT(connectionList.first.loadRelaxed() != c);
                }
                if (needToUnlock)
                    m->unlock();
            }
        }

        /* Disconnect all senders:
         */
        while (QObjectPrivate::Connection *node = cd->senders) {
            Q_ASSERT(node->receiver.loadAcquire());
            QObject *sender = node->sender;
            // Send disconnectNotify before removing the connection from sender's connection list.
            // This ensures any eventual destructor of sender will block on getting receiver's lock
            // and not finish until we release it.
            sender->disconnectNotify(QMetaObjectPrivate::signal(sender->metaObject(), node->signal_index));
            QBasicMutex *m = signalSlotLock(sender);
            bool needToUnlock = QOrderedMutexLocker::relock(signalSlotMutex, m);
            //the node has maybe been removed while the mutex was unlocked in relock?
            if (node != cd->senders) {
                // We hold the wrong mutex
                Q_ASSERT(needToUnlock);
                m->unlock();
                continue;
            }

            QObjectPrivate::ConnectionData *senderData = sender->d_func()->connections.loadRelaxed();
            Q_ASSERT(senderData);

            QtPrivate::QSlotObjectBase *slotObj = nullptr;
            if (node->isSlotObject) {
                slotObj = node->slotObj;
                node->isSlotObject = false;
            }

            senderData->removeConnection(node);
            /*
              When we unlock, another thread has the chance to delete/modify sender data.
              Thus we need to call cleanOrphanedConnections before unlocking. We use the
              variant of the function which assumes that the lock is already held to avoid
              a deadlock.
              We need to hold m, the sender lock. Considering that we might execute arbitrary user
              code, we should already release the signalSlotMutex here – unless they are the same.
            */
            const bool locksAreTheSame = signalSlotMutex == m;
            if (!locksAreTheSame)
                locker.unlock();
            senderData->cleanOrphanedConnections(
                        sender,
                        QObjectPrivate::ConnectionData::AlreadyLockedAndTemporarilyReleasingLock
                        );
            if (needToUnlock)
                m->unlock();

            if (locksAreTheSame) // otherwise already unlocked
                locker.unlock();
            if (slotObj)
                slotObj->destroyIfLastRef();
            locker.relock();
        }

        // invalidate all connections on the object and make sure
        // activate() will skip them
        cd->currentConnectionId.storeRelaxed(0);
    }
    if (cd && !cd->ref.deref())
        delete cd;
    d->connections.storeRelaxed(nullptr);

    if (!d->children.isEmpty())
        d->deleteChildren();

    if (Q_UNLIKELY(qtHookData[QHooks::RemoveQObject]))
        reinterpret_cast<QHooks::RemoveQObjectCallback>(qtHookData[QHooks::RemoveQObject])(this);

    Q_TRACE(QObject_dtor, this);

    if (d->parent)        // remove it from parent object
        d->setParent_helper(nullptr);
}